

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkDirFrame::ConstraintsBiLoad_C
          (ChLinkDirFrame *this,double factor,double recovery_clamp,bool do_clamp)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  element_type *peVar8;
  element_type *peVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_78;
  ChMatrix33<double> local_58;
  
  peVar8 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  auVar3 = *(undefined1 (*) [32])(this->m_csys).rot.m_data;
  dVar1 = (this->m_csys).rot.m_data[1];
  auVar25._24_8_ = dVar1;
  auVar25._16_8_ = dVar1;
  dVar1 = *(double *)
           ((long)(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar2 = *(undefined1 (*) [16])
            ((long)(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data +
            0x10);
  auVar11 = vpermpd_avx2(auVar3,1);
  auVar12 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])((this->m_csys).rot.m_data + 2)),0x15);
  auVar21._0_8_ = -dVar1;
  auVar21._8_8_ = 0x8000000000000000;
  auVar18._0_8_ = -auVar2._0_8_;
  auVar18._8_8_ = -auVar2._8_8_;
  auVar10 = vunpcklpd_avx(auVar21,auVar14);
  auVar17._16_16_ = auVar2;
  auVar17._0_16_ = auVar10;
  auVar13._0_8_ = auVar11._0_8_ * auVar10._0_8_;
  auVar13._8_8_ = auVar11._8_8_ * auVar10._8_8_;
  auVar13._16_8_ = auVar11._16_8_ * auVar2._0_8_;
  auVar13._24_8_ = auVar11._24_8_ * auVar2._8_8_;
  dVar1 = (peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  auVar11._8_8_ = dVar1;
  auVar11._0_8_ = dVar1;
  auVar11._16_8_ = dVar1;
  auVar11._24_8_ = dVar1;
  auVar13 = vfmadd231pd_avx512vl(auVar13,auVar3,auVar11);
  dVar1 = *(double *)
           ((long)(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data +
           0x18);
  auVar24._24_8_ = dVar1;
  auVar24._16_8_ = dVar1;
  dVar1 = (this->m_csys).rot.m_data[2];
  auVar25._8_8_ = dVar1;
  auVar25._0_8_ = dVar1;
  auVar3 = vpermpd_avx2(auVar17,0x66);
  auVar24._0_16_ = auVar18;
  auVar20._16_16_ = auVar21;
  auVar20._0_16_ = auVar18;
  auVar3 = vshufpd_avx(auVar20,auVar3,9);
  auVar11 = vpermpd_avx2(auVar24,0x24);
  auVar2 = vfmadd213pd_fma(auVar25,auVar11,auVar13);
  auVar2 = vfmadd213pd_fma(auVar3,auVar12,ZEXT1632(auVar2));
  local_78.m_data = (double  [4])ZEXT1632(auVar2);
  ChMatrix33<double>::ChMatrix33(&local_58,&local_78);
  peVar9 = (this->m_node).super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)&(peVar9->super_ChNodeFEAxyz).field_0xf0;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)&peVar9->field_0x100;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(double *)&peVar9->field_0xf8 *
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar2 = vfmadd231sd_fma(auVar23,auVar15,auVar2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(double *)&peVar9->field_0xf8 *
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar10 = vfmadd231sd_fma(auVar19,auVar15,auVar10);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = factor;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar2 = vfmadd231sd_fma(auVar2,auVar22,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar10 = vfmadd231sd_fma(auVar10,auVar22,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->constraint1).super_ChConstraintTwo.super_ChConstraint.b_i;
  auVar2 = vfmadd213sd_fma(auVar2,auVar16,auVar6);
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.b_i = auVar2._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->constraint2).super_ChConstraintTwo.super_ChConstraint.b_i;
  auVar2 = vfmadd213sd_fma(auVar10,auVar16,auVar7);
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.b_i = auVar2._0_8_;
  return;
}

Assistant:

void ChLinkDirFrame::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    // if (!IsActive())
    //	return;

    ChMatrix33<> Arw = m_csys.rot >> m_body->coord.rot;
    ChVector<> res = Arw.transpose() * m_node->GetD();

    constraint1.Set_b_i(constraint1.Get_b_i() + factor * res.y());
    constraint2.Set_b_i(constraint2.Get_b_i() + factor * res.z());
}